

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

void Cec_ManSimCreateInfo(Cec_ManSim_t *p,Vec_Ptr_t *vInfoCis,Vec_Ptr_t *vInfoCos)

{
  uint uVar1;
  void *pvVar2;
  Gia_Man_t *pGVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  if (p->pPars->fSeqSimulate != 0) {
    pGVar3 = p->pAig;
    iVar7 = pGVar3->nRegs;
    if (0 < iVar7) {
      if ((vInfoCis != (Vec_Ptr_t *)0x0) && (vInfoCos != (Vec_Ptr_t *)0x0)) {
        for (iVar6 = 0; iVar6 < pGVar3->vCis->nSize - iVar7; iVar6 = iVar6 + 1) {
          pvVar2 = Vec_PtrEntry(vInfoCis,iVar6);
          for (lVar5 = 0; lVar5 < p->nWords; lVar5 = lVar5 + 1) {
            uVar1 = Gia_ManRandom(0);
            *(uint *)((long)pvVar2 + lVar5 * 4) = uVar1;
          }
          pGVar3 = p->pAig;
          iVar7 = pGVar3->nRegs;
        }
        for (iVar6 = 0; iVar6 < iVar7; iVar6 = iVar6 + 1) {
          pvVar2 = Vec_PtrEntry(vInfoCis,(iVar6 - iVar7) + pGVar3->vCis->nSize);
          pvVar4 = Vec_PtrEntry(vInfoCos,(p->pAig->vCos->nSize + iVar6) - p->pAig->nRegs);
          for (lVar5 = 0; lVar5 < p->nWords; lVar5 = lVar5 + 1) {
            *(undefined4 *)((long)pvVar2 + lVar5 * 4) = *(undefined4 *)((long)pvVar4 + lVar5 * 4);
          }
          pGVar3 = p->pAig;
          iVar7 = pGVar3->nRegs;
        }
        return;
      }
      __assert_fail("vInfoCis && vInfoCos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecClass.c"
                    ,0x32e,"void Cec_ManSimCreateInfo(Cec_ManSim_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
    }
  }
  for (iVar7 = 0; iVar7 < p->pAig->vCis->nSize; iVar7 = iVar7 + 1) {
    pvVar2 = Vec_PtrEntry(vInfoCis,iVar7);
    for (lVar5 = 0; lVar5 < p->nWords; lVar5 = lVar5 + 1) {
      uVar1 = Gia_ManRandom(0);
      *(uint *)((long)pvVar2 + lVar5 * 4) = uVar1;
    }
  }
  return;
}

Assistant:

void Cec_ManSimCreateInfo( Cec_ManSim_t * p, Vec_Ptr_t * vInfoCis, Vec_Ptr_t * vInfoCos )
{
    unsigned * pRes0, * pRes1;
    int i, w;
    if ( p->pPars->fSeqSimulate && Gia_ManRegNum(p->pAig) > 0 )
    {
        assert( vInfoCis && vInfoCos );
        for ( i = 0; i < Gia_ManPiNum(p->pAig); i++ )
        {
            pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, i );
            for ( w = 0; w < p->nWords; w++ )
                pRes0[w] = Gia_ManRandom( 0 );
        }
        for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        {
            pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, Gia_ManPiNum(p->pAig) + i );
            pRes1 = (unsigned *)Vec_PtrEntry( vInfoCos, Gia_ManPoNum(p->pAig) + i );
            for ( w = 0; w < p->nWords; w++ )
                pRes0[w] = pRes1[w];
        }
    }
    else 
    {
        for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
        {
            pRes0 = (unsigned *)Vec_PtrEntry( vInfoCis, i );
            for ( w = 0; w < p->nWords; w++ )
                pRes0[w] = Gia_ManRandom( 0 );
        }
    }
}